

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

int dpfb::unicode::encodeUtf16(char32_t cp,char16_t *out)

{
  if ((uint)cp < 0x10000) {
    *out = (char16_t)cp;
  }
  else {
    if ((uint)cp < 0x110000) {
      *out = (ushort)((uint)(cp + L'\x00ff0000') >> 10) | 0xd800;
      out[1] = (char16_t)cp & 0x3ffU | 0xdc00;
      return 2;
    }
    *out = L'�';
  }
  return 1;
}

Assistant:

int encodeUtf16(char32_t cp, char16_t out[2])
{
    if (cp < 0x10000) {
        out[0] = cp;
        return 1;
    } else if (cp <= maxCp) {
        cp -= 0x10000;
        out[0] = leadingSurrogateMin + ((cp >> 10) & 0x3ff);
        out[1] = trailingSurrogateMin + (cp & 0x3ff);
        return 2;
    }

    out[0] = replacementCharacter;
    return 1;
}